

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O0

void __thiscall
capnp::UnalignedFlatArrayMessageReader::UnalignedFlatArrayMessageReader
          (UnalignedFlatArrayMessageReader *this,ArrayPtr<const_capnp::word> array,
          ReaderOptions options)

{
  uint uVar1;
  uint uVar2;
  word *pwVar3;
  size_t sVar4;
  Exception *pEVar5;
  ArrayPtr<const_capnp::word> *pAVar6;
  ArrayPtr<const_capnp::word> AVar7;
  ReaderOptions options_00;
  Fault local_c0;
  Fault f_2;
  uint segmentSize_1;
  uint i;
  ArrayPtr<const_capnp::word> local_98;
  Fault local_88;
  Fault f_1;
  uint segmentSize;
  Fault f;
  size_t offset;
  uint segmentCount;
  WireValue<uint32_t>_conflict *table;
  UnalignedFlatArrayMessageReader *this_local;
  ReaderOptions options_local;
  ArrayPtr<const_capnp::word> array_local;
  
  options_local._8_8_ = array.ptr;
  options_local.traversalLimitInWords._0_4_ = options.nestingLimit;
  options_00._12_4_ = 0;
  options_00.traversalLimitInWords = SUB128(options._0_12_,0);
  options_00.nestingLimit = SUB124(options._0_12_,8);
  MessageReader::MessageReader(&this->super_MessageReader,options_00);
  (this->super_MessageReader)._vptr_MessageReader =
       (_func_int **)&PTR__UnalignedFlatArrayMessageReader_00cd9828;
  kj::ArrayPtr<const_capnp::word>::ArrayPtr(&this->segment0);
  kj::Array<kj::ArrayPtr<const_capnp::word>_>::Array(&this->moreSegments);
  pwVar3 = kj::ArrayPtr<const_capnp::word>::end
                     ((ArrayPtr<const_capnp::word> *)&options_local.nestingLimit);
  this->end = pwVar3;
  sVar4 = kj::ArrayPtr<const_capnp::word>::size
                    ((ArrayPtr<const_capnp::word> *)&options_local.nestingLimit);
  if (sVar4 != 0) {
    pwVar3 = kj::ArrayPtr<const_capnp::word>::begin
                       ((ArrayPtr<const_capnp::word> *)&options_local.nestingLimit);
    uVar1 = capnp::_::DirectWireValue<unsigned_int>::get((DirectWireValue<unsigned_int> *)pwVar3);
    uVar2 = uVar1 + 1;
    f.exception = (Exception *)(ulong)((uVar2 >> 1) + 1);
    pEVar5 = (Exception *)
             kj::ArrayPtr<const_capnp::word>::size
                       ((ArrayPtr<const_capnp::word> *)&options_local.nestingLimit);
    if (pEVar5 < f.exception) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[43]>
                ((Fault *)&stack0xffffffffffffff88,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize.c++"
                 ,0x2b,FAILED,"array.size() >= offset",
                 "\"Message ends prematurely in segment table.\"",
                 (char (*) [43])"Message ends prematurely in segment table.");
      kj::_::Debug::Fault::~Fault((Fault *)&stack0xffffffffffffff88);
    }
    else {
      f_1.exception._4_4_ =
           capnp::_::DirectWireValue<unsigned_int>::get
                     ((DirectWireValue<unsigned_int> *)((long)&pwVar3->content + 4));
      sVar4 = kj::ArrayPtr<const_capnp::word>::size
                        ((ArrayPtr<const_capnp::word> *)&options_local.nestingLimit);
      if (sVar4 < (long)(f.exception)->trace + ((ulong)f_1.exception._4_4_ - 0x50)) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[43]>
                  (&local_88,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize.c++"
                   ,0x33,FAILED,"array.size() >= offset + segmentSize",
                   "\"Message ends prematurely in first segment.\"",
                   (char (*) [43])"Message ends prematurely in first segment.");
        kj::_::Debug::Fault::~Fault(&local_88);
      }
      else {
        local_98 = kj::ArrayPtr<const_capnp::word>::slice
                             ((ArrayPtr<const_capnp::word> *)&options_local.nestingLimit,
                              (size_t)f.exception,
                              (long)(f.exception)->trace + ((ulong)f_1.exception._4_4_ - 0x50));
        this->segment0 = local_98;
        f.exception = (Exception *)
                      ((long)(f.exception)->trace + ((ulong)f_1.exception._4_4_ - 0x50));
        if (1 < uVar2) {
          kj::heapArray<kj::ArrayPtr<capnp::word_const>>
                    ((Array<kj::ArrayPtr<const_capnp::word>_> *)&segmentSize_1,(kj *)(ulong)uVar1,
                     (size_t)local_98.ptr);
          kj::Array<kj::ArrayPtr<const_capnp::word>_>::operator=
                    (&this->moreSegments,(Array<kj::ArrayPtr<const_capnp::word>_> *)&segmentSize_1);
          kj::Array<kj::ArrayPtr<const_capnp::word>_>::~Array
                    ((Array<kj::ArrayPtr<const_capnp::word>_> *)&segmentSize_1);
          for (f_2.exception._4_4_ = 1; f_2.exception._4_4_ < uVar2;
              f_2.exception._4_4_ = f_2.exception._4_4_ + 1) {
            f_2.exception._0_4_ =
                 capnp::_::DirectWireValue<unsigned_int>::get
                           ((DirectWireValue<unsigned_int> *)
                            ((long)&pwVar3->content + (ulong)(f_2.exception._4_4_ + 1) * 4));
            sVar4 = kj::ArrayPtr<const_capnp::word>::size
                              ((ArrayPtr<const_capnp::word> *)&options_local.nestingLimit);
            if (sVar4 < (long)(f.exception)->trace + ((ulong)(uint)f_2.exception - 0x50)) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
                        (&local_c0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize.c++"
                         ,0x41,FAILED,"array.size() >= offset + segmentSize",
                         "\"Message ends prematurely.\"",(char (*) [26])"Message ends prematurely.")
              ;
              kj::Array<kj::ArrayPtr<const_capnp::word>_>::operator=
                        (&this->moreSegments,(void *)0x0);
              kj::_::Debug::Fault::~Fault(&local_c0);
              return;
            }
            AVar7 = kj::ArrayPtr<const_capnp::word>::slice
                              ((ArrayPtr<const_capnp::word> *)&options_local.nestingLimit,
                               (size_t)f.exception,
                               (long)(f.exception)->trace + ((ulong)(uint)f_2.exception - 0x50));
            pAVar6 = kj::Array<kj::ArrayPtr<const_capnp::word>_>::operator[]
                               (&this->moreSegments,(ulong)(f_2.exception._4_4_ - 1));
            *pAVar6 = AVar7;
            f.exception = (Exception *)
                          ((long)(f.exception)->trace + ((ulong)(uint)f_2.exception - 0x50));
          }
        }
        pwVar3 = kj::ArrayPtr<const_capnp::word>::begin
                           ((ArrayPtr<const_capnp::word> *)&options_local.nestingLimit);
        this->end = pwVar3 + (long)f.exception;
      }
    }
  }
  return;
}

Assistant:

UnalignedFlatArrayMessageReader::UnalignedFlatArrayMessageReader(
    kj::ArrayPtr<const word> array, ReaderOptions options)
    : MessageReader(options), end(array.end()) {
  if (array.size() < 1) {
    // Assume empty message.
    return;
  }

  const _::WireValue<uint32_t>* table =
      reinterpret_cast<const _::WireValue<uint32_t>*>(array.begin());

  uint segmentCount = table[0].get() + 1;
  size_t offset = segmentCount / 2u + 1u;

  KJ_REQUIRE(array.size() >= offset, "Message ends prematurely in segment table.") {
    return;
  }

  {
    uint segmentSize = table[1].get();

    KJ_REQUIRE(array.size() >= offset + segmentSize,
               "Message ends prematurely in first segment.") {
      return;
    }

    segment0 = array.slice(offset, offset + segmentSize);
    offset += segmentSize;
  }

  if (segmentCount > 1) {
    moreSegments = kj::heapArray<kj::ArrayPtr<const word>>(segmentCount - 1);

    for (uint i = 1; i < segmentCount; i++) {
      uint segmentSize = table[i + 1].get();

      KJ_REQUIRE(array.size() >= offset + segmentSize, "Message ends prematurely.") {
        moreSegments = nullptr;
        return;
      }

      moreSegments[i - 1] = array.slice(offset, offset + segmentSize);
      offset += segmentSize;
    }
  }

  end = array.begin() + offset;
}